

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

int __thiscall TiXmlElement::QueryBoolAttribute(TiXmlElement *this,char *name,bool *bval)

{
  bool bVar1;
  TiXmlAttribute *pTVar2;
  int iVar3;
  bool bVar4;
  
  pTVar2 = TiXmlAttributeSet::Find(&this->attributeSet,name);
  if (pTVar2 == (TiXmlAttribute *)0x0) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    bVar1 = TiXmlBase::StringEqual(((pTVar2->value).rep_)->str,"true",true,TIXML_ENCODING_UNKNOWN);
    bVar4 = true;
    if (((!bVar1) &&
        (bVar1 = TiXmlBase::StringEqual
                           (((pTVar2->value).rep_)->str,"yes",true,TIXML_ENCODING_UNKNOWN), !bVar1))
       && (bVar1 = TiXmlBase::StringEqual
                             (((pTVar2->value).rep_)->str,"1",true,TIXML_ENCODING_UNKNOWN), !bVar1))
    {
      bVar4 = false;
      bVar1 = TiXmlBase::StringEqual
                        (((pTVar2->value).rep_)->str,"false",true,TIXML_ENCODING_UNKNOWN);
      if (!bVar1) {
        bVar4 = false;
        bVar1 = TiXmlBase::StringEqual(((pTVar2->value).rep_)->str,"no",true,TIXML_ENCODING_UNKNOWN)
        ;
        if (!bVar1) {
          bVar4 = false;
          bVar1 = TiXmlBase::StringEqual
                            (((pTVar2->value).rep_)->str,"0",true,TIXML_ENCODING_UNKNOWN);
          if (!bVar1) {
            return 2;
          }
        }
      }
    }
    *bval = bVar4;
  }
  return iVar3;
}

Assistant:

int TiXmlElement::QueryBoolAttribute( const char* name, bool* bval ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;
	
	int result = TIXML_WRONG_TYPE;
	if (    StringEqual( node->Value(), "true", true, TIXML_ENCODING_UNKNOWN ) 
		 || StringEqual( node->Value(), "yes", true, TIXML_ENCODING_UNKNOWN ) 
		 || StringEqual( node->Value(), "1", true, TIXML_ENCODING_UNKNOWN ) ) 
	{
		*bval = true;
		result = TIXML_SUCCESS;
	}
	else if (    StringEqual( node->Value(), "false", true, TIXML_ENCODING_UNKNOWN ) 
			  || StringEqual( node->Value(), "no", true, TIXML_ENCODING_UNKNOWN ) 
			  || StringEqual( node->Value(), "0", true, TIXML_ENCODING_UNKNOWN ) ) 
	{
		*bval = false;
		result = TIXML_SUCCESS;
	}
	return result;
}